

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mipsdsp_arith(DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2)

{
  TCGContext_conflict6 *tcg_ctx;
  int nargs;
  uintptr_t o;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 pTVar1;
  TCGTemp *pTVar2;
  uintptr_t o_3;
  code *pcVar3;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ret == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,v1);
  gen_load_gpr(tcg_ctx,t_00,v2);
  switch(op1) {
  case 0x7c000010:
    switch((op2 + 0x83fffff0) * 0x4000000 | op2 + 0x83fffff0 >> 6) {
    case 0:
      check_dsp(ctx);
      gen_helper_addu_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 1:
      check_dsp(ctx);
      gen_helper_subu_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 4:
      check_dsp(ctx);
      gen_helper_addu_s_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 5:
      check_dsp(ctx);
      gen_helper_subu_s_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 8:
      check_dsp_r2(ctx);
      gen_helper_addu_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 9:
      check_dsp_r2(ctx);
      gen_helper_subu_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 10:
      check_dsp(ctx);
      gen_helper_addq_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xb:
      check_dsp(ctx);
      gen_helper_subq_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xc:
      check_dsp_r2(ctx);
      gen_helper_addu_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xd:
      check_dsp_r2(ctx);
      gen_helper_subu_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xe:
      check_dsp(ctx);
      gen_helper_addq_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xf:
      check_dsp(ctx);
      gen_helper_subq_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x10:
      check_dsp(ctx);
      gen_helper_addsc(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x11:
      check_dsp(ctx);
      gen_helper_addwc(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x12:
      check_dsp(ctx);
      gen_helper_modsub(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 0x14:
      check_dsp(ctx);
      gen_helper_raddu_w_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t);
      break;
    case 0x16:
      check_dsp(ctx);
      gen_helper_addq_s_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x17:
      check_dsp(ctx);
      gen_helper_subq_s_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    goto switchD_0088be7e_caseD_7c000013;
  case 0x7c000011:
    if (op2 == 0x7c000311) {
      check_dsp(ctx);
      gen_helper_precrq_qb_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      goto switchD_0088be7e_caseD_7c000013;
    }
    if (op2 == 0x7c0007d1) {
      check_dsp_r2(ctx);
      pTVar1 = tcg_const_i32_mips64el(tcg_ctx,v2);
      gen_helper_precr_sra_r_ph_w
                (tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],pTVar1,t,tcg_ctx->cpu_gpr[(uint)ret]);
    }
    else {
      if (op2 == 0x7c0003d1) {
        check_dsp(ctx);
        gen_helper_precrqu_s_qb_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
        goto switchD_0088be7e_caseD_7c000013;
      }
      if (op2 == 0x7c000511) {
        check_dsp(ctx);
        gen_helper_precrq_ph_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
        goto switchD_0088be7e_caseD_7c000013;
      }
      if (op2 == 0x7c000551) {
        check_dsp(ctx);
        gen_helper_precrq_rs_ph_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
        goto switchD_0088be7e_caseD_7c000013;
      }
      if (op2 != 0x7c000791) {
        if (op2 == 0x7c000351) {
          check_dsp_r2(ctx);
          gen_helper_precr_qb_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
        }
        goto switchD_0088be7e_caseD_7c000013;
      }
      check_dsp_r2(ctx);
      pTVar1 = tcg_const_i32_mips64el(tcg_ctx,v2);
      gen_helper_precr_sra_ph_w
                (tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],pTVar1,t,tcg_ctx->cpu_gpr[(uint)ret]);
    }
    pTVar2 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    goto LAB_0088c375;
  case 0x7c000012:
    switch((op2 + 0x83ffffae) * 0x4000000 | op2 + 0x83ffffae >> 6) {
    case 0:
      check_dsp_r2(ctx);
      gen_helper_absq_s_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,tcg_ctx->cpu_env);
      break;
    case 3:
      check_dsp(ctx);
      gen_helper_precequ_ph_qbl(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 4:
      check_dsp(ctx);
      gen_helper_precequ_ph_qbr(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 5:
      check_dsp(ctx);
      gen_helper_precequ_ph_qbla(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 6:
      check_dsp(ctx);
      gen_helper_precequ_ph_qbra(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 8:
      check_dsp(ctx);
      gen_helper_absq_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,tcg_ctx->cpu_env);
      break;
    case 0xb:
      check_dsp(ctx);
      tcg_gen_andi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,0xffff0000);
      goto LAB_0088c767;
    case 0xc:
      check_dsp(ctx);
      tcg_gen_andi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,0xffff);
      tcg_gen_shli_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],tcg_ctx->cpu_gpr[(uint)ret],0x10);
LAB_0088c767:
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],tcg_ctx->cpu_gpr[(uint)ret]);
      break;
    case 0x10:
      check_dsp(ctx);
      gen_helper_absq_s_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,tcg_ctx->cpu_env);
      break;
    case 0x1b:
      check_dsp(ctx);
      gen_helper_preceu_ph_qbl(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 0x1c:
      check_dsp(ctx);
      gen_helper_preceu_ph_qbr(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 0x1d:
      check_dsp(ctx);
      gen_helper_preceu_ph_qbla(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
      break;
    case 0x1e:
      check_dsp(ctx);
      gen_helper_preceu_ph_qbra(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00);
    }
  default:
    goto switchD_0088be7e_caseD_7c000013;
  case 0x7c000014:
    break;
  case 0x7c000015:
    switch((op2 + 0x83fffceb) * 0x4000000 | op2 + 0x83fffceb >> 6) {
    case 0:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t + (long)tcg_ctx);
      local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precrq_ob_qh_mips64el;
      break;
    case 1:
      check_dsp_r2(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t + (long)tcg_ctx);
      local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precr_ob_qh_mips64el;
      break;
    default:
      goto switchD_0088be7e_caseD_7c000013;
    case 3:
      check_dsp(ctx);
      local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      pcVar3 = helper_precrqu_s_ob_qh_mips64el;
      goto LAB_0088d387;
    case 8:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t + (long)tcg_ctx);
      local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precrq_qh_pw_mips64el;
      break;
    case 9:
      check_dsp(ctx);
      local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      pcVar3 = helper_precrq_rs_qh_pw_mips64el;
      goto LAB_0088d387;
    case 0x10:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t + (long)tcg_ctx);
      local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precrq_pw_l_mips64el;
      break;
    case 0x12:
      check_dsp_r2(ctx);
      pTVar1 = tcg_const_i32_mips64el(tcg_ctx,ret);
      pcVar3 = helper_precr_sra_qh_pw_mips64el;
      goto LAB_0088c36a;
    case 0x13:
      check_dsp_r2(ctx);
      pTVar1 = tcg_const_i32_mips64el(tcg_ctx,ret);
      pcVar3 = helper_precr_sra_r_qh_pw_mips64el;
LAB_0088c36a:
      local_48 = (TCGTemp *)(t + (long)tcg_ctx);
      pTVar2 = (TCGTemp *)(pTVar1 + (long)&tcg_ctx->pool_cur);
      local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      local_38 = pTVar2;
      tcg_gen_callN_mips64el(tcg_ctx,pcVar3,local_40,3,&local_48);
LAB_0088c375:
      tcg_temp_free_internal_mips64el(tcg_ctx,pTVar2);
      goto switchD_0088be7e_caseD_7c000013;
    }
    goto LAB_0088d3c3;
  case 0x7c000016:
    switch((op2 + 0x83ffffaa) * 0x4000000 | op2 + 0x83ffffaa >> 6) {
    case 0:
      check_dsp_r2(ctx);
      local_40 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_absq_s_ob_mips64el;
      goto LAB_0088d3c3;
    default:
      goto switchD_0088be7e_caseD_7c000013;
    case 3:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precequ_qh_obl_mips64el;
      break;
    case 4:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precequ_qh_obr_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precequ_qh_obla_mips64el;
      break;
    case 6:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_precequ_qh_obra_mips64el;
      break;
    case 8:
      check_dsp(ctx);
      local_40 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_absq_s_qh_mips64el;
      goto LAB_0088d3c3;
    case 0xb:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceq_pw_qhl_mips64el;
      break;
    case 0xc:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceq_pw_qhr_mips64el;
      break;
    case 0xd:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceq_pw_qhla_mips64el;
      break;
    case 0xe:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceq_pw_qhra_mips64el;
      break;
    case 0x10:
      check_dsp(ctx);
      local_40 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_absq_s_pw_mips64el;
      goto LAB_0088d3c3;
    case 0x13:
      check_dsp(ctx);
      tcg_gen_andi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,-0x100000000);
      goto switchD_0088be7e_caseD_7c000013;
    case 0x14:
      check_dsp(ctx);
      tcg_gen_shli_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t_00,0x20);
      goto switchD_0088be7e_caseD_7c000013;
    case 0x1b:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceu_qh_obl_mips64el;
      break;
    case 0x1c:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceu_qh_obr_mips64el;
      break;
    case 0x1d:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceu_qh_obla_mips64el;
      break;
    case 0x1e:
      check_dsp(ctx);
      pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      local_48 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
      pcVar3 = helper_preceu_qh_obra_mips64el;
    }
LAB_0088d186:
    nargs = 1;
    goto LAB_0088d3c5;
  case 0x7c000018:
    check_dsp_r2(ctx);
    switch((op2 + 0x83ffffe8) * 0x4000000 | op2 + 0x83ffffe8 >> 6) {
    case 0:
      gen_helper_adduh_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 1:
      gen_helper_subuh_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 2:
      gen_helper_adduh_r_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 3:
      gen_helper_subuh_r_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 8:
      gen_helper_addqh_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 9:
      gen_helper_subqh_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 10:
      gen_helper_addqh_r_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 0xb:
      gen_helper_subqh_r_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 0x10:
      gen_helper_addqh_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 0x11:
      gen_helper_subqh_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 0x12:
      gen_helper_addqh_r_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
      break;
    case 0x13:
      gen_helper_subqh_r_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00);
    }
    goto switchD_0088be7e_caseD_7c000013;
  }
  switch((op2 + 0x83ffffec) * 0x4000000 | op2 + 0x83ffffec >> 6) {
  case 0:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addu_ob_mips64el;
    break;
  case 1:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subu_ob_mips64el;
    break;
  default:
    goto switchD_0088be7e_caseD_7c000013;
  case 4:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addu_s_ob_mips64el;
    break;
  case 5:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subu_s_ob_mips64el;
    break;
  case 8:
    check_dsp_r2(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addu_qh_mips64el;
    break;
  case 9:
    check_dsp_r2(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subu_qh_mips64el;
    break;
  case 10:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addq_qh_mips64el;
    break;
  case 0xb:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subq_qh_mips64el;
    break;
  case 0xc:
    check_dsp_r2(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addu_s_qh_mips64el;
    break;
  case 0xd:
    check_dsp_r2(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subu_s_qh_mips64el;
    break;
  case 0xe:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addq_s_qh_mips64el;
    break;
  case 0xf:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subq_s_qh_mips64el;
    break;
  case 0x12:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addq_pw_mips64el;
    break;
  case 0x13:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subq_pw_mips64el;
    break;
  case 0x14:
    check_dsp(ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    local_48 = (TCGTemp *)(t + (long)tcg_ctx);
    pcVar3 = helper_raddu_l_ob_mips64el;
    goto LAB_0088d186;
  case 0x16:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_addq_s_pw_mips64el;
    break;
  case 0x17:
    check_dsp(ctx);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    pcVar3 = helper_subq_s_pw_mips64el;
    break;
  case 0x18:
    check_dsp_r2(ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    local_48 = (TCGTemp *)(t + (long)tcg_ctx);
    local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar3 = helper_adduh_ob_mips64el;
    goto LAB_0088d3c3;
  case 0x19:
    check_dsp_r2(ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    local_48 = (TCGTemp *)(t + (long)tcg_ctx);
    local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar3 = helper_subuh_ob_mips64el;
    goto LAB_0088d3c3;
  case 0x1a:
    check_dsp_r2(ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    local_48 = (TCGTemp *)(t + (long)tcg_ctx);
    local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar3 = helper_adduh_r_ob_mips64el;
    goto LAB_0088d3c3;
  case 0x1b:
    check_dsp_r2(ctx);
    pTVar2 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    local_48 = (TCGTemp *)(t + (long)tcg_ctx);
    local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
    pcVar3 = helper_subuh_r_ob_mips64el;
LAB_0088d3c3:
    nargs = 2;
    goto LAB_0088d3c5;
  }
LAB_0088d387:
  local_40 = (TCGTemp *)(t_00 + (long)&tcg_ctx->pool_cur);
  local_48 = (TCGTemp *)(t + (long)tcg_ctx);
  nargs = 3;
LAB_0088d3c5:
  tcg_gen_callN_mips64el(tcg_ctx,pcVar3,pTVar2,nargs,&local_48);
switchD_0088be7e_caseD_7c000013:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mipsdsp_arith(DisasContext *ctx, uint32_t op1, uint32_t op2,
                              int ret, int v1, int v2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv v1_t;
    TCGv v2_t;

    if (ret == 0) {
        /* Treat as NOP. */
        return;
    }

    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    /* OPC_MULT_G_2E is equal OPC_ADDUH_QB_DSP */
    case OPC_MULT_G_2E:
        check_dsp_r2(ctx);
        switch (op2) {
        case OPC_ADDUH_QB:
            gen_helper_adduh_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDUH_R_QB:
            gen_helper_adduh_r_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_PH:
            gen_helper_addqh_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_R_PH:
            gen_helper_addqh_r_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_W:
            gen_helper_addqh_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQH_R_W:
            gen_helper_addqh_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_QB:
            gen_helper_subuh_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_R_QB:
            gen_helper_subuh_r_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_PH:
            gen_helper_subqh_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_R_PH:
            gen_helper_subqh_r_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_W:
            gen_helper_subqh_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBQH_R_W:
            gen_helper_subqh_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
    case OPC_ABSQ_S_PH_DSP:
        switch (op2) {
        case OPC_ABSQ_S_QB:
            check_dsp_r2(ctx);
            gen_helper_absq_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_PH:
            check_dsp(ctx);
            gen_helper_absq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_W:
            check_dsp(ctx);
            gen_helper_absq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECEQ_W_PHL:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0xFFFF0000);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret]);
            break;
        case OPC_PRECEQ_W_PHR:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0x0000FFFF);
            tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret], 16);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], tcg_ctx->cpu_gpr[ret]);
            break;
        case OPC_PRECEQU_PH_QBL:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBR:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBLA:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_PH_QBRA:
            check_dsp(ctx);
            gen_helper_precequ_ph_qbra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBL:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBR:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBLA:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_PH_QBRA:
            check_dsp(ctx);
            gen_helper_preceu_ph_qbra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        }
        break;
    case OPC_ADDU_QB_DSP:
        switch (op2) {
        case OPC_ADDQ_PH:
            check_dsp(ctx);
            gen_helper_addq_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_PH:
            check_dsp(ctx);
            gen_helper_addq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_W:
            check_dsp(ctx);
            gen_helper_addq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_QB:
            check_dsp(ctx);
            gen_helper_addu_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_QB:
            check_dsp(ctx);
            gen_helper_addu_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_PH:
            check_dsp_r2(ctx);
            gen_helper_addu_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_PH:
            check_dsp_r2(ctx);
            gen_helper_addu_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_PH:
            check_dsp(ctx);
            gen_helper_subq_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_PH:
            check_dsp(ctx);
            gen_helper_subq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_W:
            check_dsp(ctx);
            gen_helper_subq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_QB:
            check_dsp(ctx);
            gen_helper_subu_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_QB:
            check_dsp(ctx);
            gen_helper_subu_s_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_PH:
            check_dsp_r2(ctx);
            gen_helper_subu_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_PH:
            check_dsp_r2(ctx);
            gen_helper_subu_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDSC:
            check_dsp(ctx);
            gen_helper_addsc(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDWC:
            check_dsp(ctx);
            gen_helper_addwc(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MODSUB:
            check_dsp(ctx);
            gen_helper_modsub(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_RADDU_W_QB:
            check_dsp(ctx);
            gen_helper_raddu_w_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t);
            break;
        }
        break;
    case OPC_CMPU_EQ_QB_DSP:
        switch (op2) {
        case OPC_PRECR_QB_PH:
            check_dsp_r2(ctx);
            gen_helper_precr_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_QB_PH:
            check_dsp(ctx);
            gen_helper_precrq_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECR_SRA_PH_W:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_t = tcg_const_i32(tcg_ctx, v2);
                gen_helper_precr_sra_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], sa_t, v1_t,
                                          tcg_ctx->cpu_gpr[ret]);
                tcg_temp_free_i32(tcg_ctx, sa_t);
                break;
            }
        case OPC_PRECR_SRA_R_PH_W:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_t = tcg_const_i32(tcg_ctx, v2);
                gen_helper_precr_sra_r_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], sa_t, v1_t,
                                            tcg_ctx->cpu_gpr[ret]);
                tcg_temp_free_i32(tcg_ctx, sa_t);
                break;
            }
        case OPC_PRECRQ_PH_W:
            check_dsp(ctx);
            gen_helper_precrq_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_RS_PH_W:
            check_dsp(ctx);
            gen_helper_precrq_rs_ph_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECRQU_S_QB_PH:
            check_dsp(ctx);
            gen_helper_precrqu_s_qb_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_ABSQ_S_QH_DSP:
        switch (op2) {
        case OPC_PRECEQ_L_PWL:
            check_dsp(ctx);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 0xFFFFFFFF00000000ull);
            break;
        case OPC_PRECEQ_L_PWR:
            check_dsp(ctx);
            tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, 32);
            break;
        case OPC_PRECEQ_PW_QHL:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHR:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHLA:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQ_PW_QHRA:
            check_dsp(ctx);
            gen_helper_preceq_pw_qhra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBL:
            check_dsp(ctx);
            gen_helper_precequ_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBR:
            check_dsp(ctx);
            gen_helper_precequ_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBLA:
            check_dsp(ctx);
            gen_helper_precequ_qh_obla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEQU_QH_OBRA:
            check_dsp(ctx);
            gen_helper_precequ_qh_obra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBL:
            check_dsp(ctx);
            gen_helper_preceu_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBR:
            check_dsp(ctx);
            gen_helper_preceu_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBLA:
            check_dsp(ctx);
            gen_helper_preceu_qh_obla(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_PRECEU_QH_OBRA:
            check_dsp(ctx);
            gen_helper_preceu_qh_obra(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t);
            break;
        case OPC_ABSQ_S_OB:
            check_dsp_r2(ctx);
            gen_helper_absq_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_PW:
            check_dsp(ctx);
            gen_helper_absq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ABSQ_S_QH:
            check_dsp(ctx);
            gen_helper_absq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
    case OPC_ADDU_OB_DSP:
        switch (op2) {
        case OPC_RADDU_L_OB:
            check_dsp(ctx);
            gen_helper_raddu_l_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t);
            break;
        case OPC_SUBQ_PW:
            check_dsp(ctx);
            gen_helper_subq_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_PW:
            check_dsp(ctx);
            gen_helper_subq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_QH:
            check_dsp(ctx);
            gen_helper_subq_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBQ_S_QH:
            check_dsp(ctx);
            gen_helper_subq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_OB:
            check_dsp(ctx);
            gen_helper_subu_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_OB:
            check_dsp(ctx);
            gen_helper_subu_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_QH:
            check_dsp_r2(ctx);
            gen_helper_subu_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBU_S_QH:
            check_dsp_r2(ctx);
            gen_helper_subu_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_SUBUH_OB:
            check_dsp_r2(ctx);
            gen_helper_subuh_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_SUBUH_R_OB:
            check_dsp_r2(ctx);
            gen_helper_subuh_r_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDQ_PW:
            check_dsp(ctx);
            gen_helper_addq_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_PW:
            check_dsp(ctx);
            gen_helper_addq_s_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_QH:
            check_dsp(ctx);
            gen_helper_addq_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDQ_S_QH:
            check_dsp(ctx);
            gen_helper_addq_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_OB:
            check_dsp(ctx);
            gen_helper_addu_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_OB:
            check_dsp(ctx);
            gen_helper_addu_s_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_QH:
            check_dsp_r2(ctx);
            gen_helper_addu_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDU_S_QH:
            check_dsp_r2(ctx);
            gen_helper_addu_s_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_ADDUH_OB:
            check_dsp_r2(ctx);
            gen_helper_adduh_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_ADDUH_R_OB:
            check_dsp_r2(ctx);
            gen_helper_adduh_r_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
    case OPC_CMPU_EQ_OB_DSP:
        switch (op2) {
        case OPC_PRECR_OB_QH:
            check_dsp_r2(ctx);
            gen_helper_precr_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECR_SRA_QH_PW:
            check_dsp_r2(ctx);
            {
                TCGv_i32 ret_t = tcg_const_i32(tcg_ctx, ret);
                gen_helper_precr_sra_qh_pw(tcg_ctx, v2_t, v1_t, v2_t, ret_t);
                tcg_temp_free_i32(tcg_ctx, ret_t);
                break;
            }
        case OPC_PRECR_SRA_R_QH_PW:
            check_dsp_r2(ctx);
            {
                TCGv_i32 sa_v = tcg_const_i32(tcg_ctx, ret);
                gen_helper_precr_sra_r_qh_pw(tcg_ctx, v2_t, v1_t, v2_t, sa_v);
                tcg_temp_free_i32(tcg_ctx, sa_v);
                break;
            }
        case OPC_PRECRQ_OB_QH:
            check_dsp(ctx);
            gen_helper_precrq_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_PW_L:
            check_dsp(ctx);
            gen_helper_precrq_pw_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_QH_PW:
            check_dsp(ctx);
            gen_helper_precrq_qh_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PRECRQ_RS_QH_PW:
            check_dsp(ctx);
            gen_helper_precrq_rs_qh_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PRECRQU_S_OB_QH:
            check_dsp(ctx);
            gen_helper_precrqu_s_ob_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}